

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueSymbol.cpp
# Opt level: O0

void __thiscall
slang::ast::ValueSymbol::addDriver
          (ValueSymbol *this,DriverKind driverKind,DriverBitRange bounds,
          Expression *longestStaticPrefix,Symbol *containingSymbol,Expression *procCallExpression)

{
  Symbol *args_2;
  Compilation *args_3;
  ValueDriver *pVVar1;
  undefined1 in_SIL;
  Symbol *in_RDI;
  DriverKind *in_R8;
  Expression *in_R9;
  Expression *in_stack_00000008;
  ValueDriver *driver;
  Compilation *comp;
  Scope *scope;
  ValueDriver *in_stack_00000190;
  ValueSymbol *in_stack_00000198;
  undefined1 in_stack_000001a0 [16];
  undefined7 in_stack_ffffffffffffffe0;
  
  args_2 = (Symbol *)Symbol::getParentScope(in_RDI);
  args_3 = Scope::getCompilation((Scope *)args_2);
  pVVar1 = BumpAllocator::
           emplace<slang::ast::ValueDriver,slang::ast::DriverKind&,slang::ast::Expression_const&,slang::ast::Symbol_const&,slang::ast::AssignFlags>
                     ((BumpAllocator *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),in_R8,in_R9,args_2
                      ,(AssignFlags *)args_3);
  pVVar1->procCallExpression = in_stack_00000008;
  addDriver(in_stack_00000198,(DriverBitRange)in_stack_000001a0,in_stack_00000190);
  return;
}

Assistant:

void ValueSymbol::addDriver(DriverKind driverKind, DriverBitRange bounds,
                            const Expression& longestStaticPrefix, const Symbol& containingSymbol,
                            const Expression& procCallExpression) const {
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto& comp = scope->getCompilation();
    auto driver = comp.emplace<ValueDriver>(driverKind, longestStaticPrefix, containingSymbol,
                                            AssignFlags::None);
    driver->procCallExpression = &procCallExpression;

    addDriver(bounds, *driver);
}